

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

uint32 google::ParseCommandLineFlagsInternal
                 (int *argc,char ***argv,bool remove_flags,bool do_report)

{
  uint uVar1;
  Mutex *pMVar2;
  char **__dest;
  char cVar3;
  char *pcVar4;
  size_type sVar5;
  uint32 *puVar6;
  bool bVar7;
  int iVar8;
  uint32 uVar9;
  FlagRegistry *pFVar10;
  CommandLineFlag *flag;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  mapped_type *pmVar15;
  undefined8 *puVar16;
  long *plVar17;
  _Base_ptr p_Var18;
  undefined7 in_register_00000009;
  long *plVar19;
  size_type *psVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar21;
  ulong *puVar22;
  undefined7 in_register_00000011;
  uint uVar23;
  string key;
  string error_message;
  char *value;
  CommandLineFlagParser parser;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  undefined8 uStack_1d8;
  string local_1d0;
  string local_1b0;
  key_type local_190;
  uint32 *local_170;
  char *local_168;
  undefined4 local_160;
  undefined4 local_15c;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  undefined4 *local_138;
  undefined8 local_130;
  undefined4 local_128;
  undefined3 uStack_124;
  undefined1 local_121;
  CommandLineFlagParser local_118;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_170 = (uint32 *)argc;
  SetArgv(*argc,*argv);
  pFVar10 = anon_unknown_1::FlagRegistry::GlobalRegistry();
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar2 = &pFVar10->lock_;
  iVar8 = pMVar2->mutex_;
  pMVar2->mutex_ = pMVar2->mutex_ + -1;
  local_118.registry_ = pFVar10;
  local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (iVar8 != 0) {
LAB_0019286c:
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                  ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
  }
  anon_unknown_1::CommandLineFlagParser::ProcessFlagfileLocked
            (&local_50,&local_118,fLS::FLAGS_flagfile_abi_cxx11_,SET_FLAGS_VALUE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  anon_unknown_1::CommandLineFlagParser::ProcessFromenvLocked
            (&local_70,&local_118,fLS::FLAGS_fromenv_abi_cxx11_,SET_FLAGS_VALUE,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  anon_unknown_1::CommandLineFlagParser::ProcessFromenvLocked
            (&local_90,&local_118,fLS::FLAGS_tryfromenv_abi_cxx11_,SET_FLAGS_VALUE,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pMVar2 = &pFVar10->lock_;
  pMVar2->mutex_ = pMVar2->mutex_ + 1;
  if (pMVar2->mutex_ == 0) {
    uVar9 = *local_170;
    pMVar2 = &(local_118.registry_)->lock_;
    iVar8 = pMVar2->mutex_;
    pMVar2->mutex_ = pMVar2->mutex_ + -1;
    if (iVar8 != 0) goto LAB_0019286c;
    local_160 = (undefined4)CONCAT71(in_register_00000011,remove_flags);
    local_15c = (undefined4)CONCAT71(in_register_00000009,do_report);
    if (1 < (int)uVar9) {
      uVar23 = 1;
      do {
        puVar6 = local_170;
        pcVar4 = (*argv)[(int)uVar23];
        if ((*pcVar4 == '-') && (cVar3 = pcVar4[1], cVar3 != '\0')) {
          pcVar13 = pcVar4 + 1;
          if (cVar3 == '-') {
            pcVar13 = pcVar4 + 2;
          }
          if (pcVar4[(ulong)(cVar3 == '-') + 1] == '\0') {
            uVar9 = uVar23 + 1;
            bVar7 = true;
          }
          else {
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            local_1d0._M_string_length = 0;
            local_1d0.field_2._M_allocated_capacity =
                 local_1d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_1b0._M_string_length = 0;
            local_1b0.field_2._M_allocated_capacity =
                 local_1b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            flag = anon_unknown_1::FlagRegistry::SplitArgumentLocked
                             (local_118.registry_,pcVar13,&local_1d0,&local_168,&local_1b0);
            if (flag == (CommandLineFlag *)0x0) {
              pmVar15 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&local_118.undefined_names_,&local_1d0);
              std::__cxx11::string::_M_replace
                        ((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x19b57b);
              pmVar15 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&local_118.error_flags_,&local_1d0);
              bVar7 = false;
              std::__cxx11::string::_M_assign((string *)pmVar15);
            }
            else {
              if (local_168 == (char *)0x0) {
                lVar11 = (long)flag->defvalue_->type_;
                if (6 < lVar11) {
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                                ,0x1a2,
                                "const char *google::(anonymous namespace)::FlagValue::TypeName() const"
                               );
                }
                iVar8 = strcmp(&(anonymous_namespace)::FlagValue::TypeName()::types + lVar11 * 7,
                               "bool");
                if (iVar8 == 0) {
                  __assert_fail("strcmp(flag->type_name(), \"bool\") != 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                                ,0x434,
                                "uint32 google::(anonymous namespace)::CommandLineFlagParser::ParseNewCommandLineFlags(int *, char ***, bool)"
                               );
                }
                uVar1 = uVar23 + 1;
                if ((int)uVar9 <= (int)uVar1) {
                  local_138 = &local_128;
                  uStack_124 = 0x203a52;
                  local_128 = 0x4f525245;
                  local_130 = 7;
                  local_121 = 0;
                  plVar17 = (long *)std::__cxx11::string::append((char *)&local_138);
                  local_158 = &local_148;
                  plVar19 = plVar17 + 2;
                  if ((long *)*plVar17 == plVar19) {
                    local_148 = *plVar19;
                    lStack_140 = plVar17[3];
                  }
                  else {
                    local_148 = *plVar19;
                    local_158 = (long *)*plVar17;
                  }
                  local_150 = plVar17[1];
                  *plVar17 = (long)plVar19;
                  plVar17[1] = 0;
                  *(undefined1 *)(plVar17 + 2) = 0;
                  plVar17 = (long *)std::__cxx11::string::append((char *)&local_158);
                  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                  psVar20 = (size_type *)(plVar17 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar17 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar20) {
                    local_190.field_2._M_allocated_capacity = *psVar20;
                    local_190.field_2._8_8_ = plVar17[3];
                  }
                  else {
                    local_190.field_2._M_allocated_capacity = *psVar20;
                    local_190._M_dataplus._M_p = (pointer)*plVar17;
                  }
                  local_190._M_string_length = plVar17[1];
                  *plVar17 = (long)psVar20;
                  plVar17[1] = 0;
                  *(undefined1 *)(plVar17 + 2) = 0;
                  puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
                  local_1f0 = &local_1e0;
                  ppaVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              **)(puVar16 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       **)*puVar16 == ppaVar21) {
                    local_1e0 = *ppaVar21;
                    uStack_1d8 = puVar16[3];
                  }
                  else {
                    local_1e0 = *ppaVar21;
                    local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 **)*puVar16;
                  }
                  local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)puVar16[1];
                  *puVar16 = ppaVar21;
                  puVar16[1] = 0;
                  *(undefined1 *)(puVar16 + 2) = 0;
                  plVar17 = (long *)std::__cxx11::string::append((char *)&local_1f0);
                  local_210 = &local_200;
                  plVar19 = plVar17 + 2;
                  if ((long *)*plVar17 == plVar19) {
                    local_200 = *plVar19;
                    lStack_1f8 = plVar17[3];
                  }
                  else {
                    local_200 = *plVar19;
                    local_210 = (long *)*plVar17;
                  }
                  local_208 = plVar17[1];
                  *plVar17 = (long)plVar19;
                  plVar17[1] = 0;
                  *(undefined1 *)(plVar17 + 2) = 0;
                  pmVar15 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&local_118.error_flags_,&local_1d0);
                  std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_210);
                  if (local_210 != &local_200) {
                    operator_delete(local_210);
                  }
                  if (local_1f0 != &local_1e0) {
                    operator_delete(local_1f0);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._M_dataplus._M_p != &local_190.field_2) {
                    operator_delete(local_190._M_dataplus._M_p);
                  }
                  if (local_158 != &local_148) {
                    operator_delete(local_158);
                  }
                  if (local_138 != &local_128) {
                    operator_delete(local_138);
                  }
                  if ((flag->help_ != (char *)0x0) && ('\x01' < *flag->help_)) {
                    local_190._M_dataplus._M_p = (pointer)0x14;
                    local_1f0 = &local_1e0;
                    local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 **)std::__cxx11::string::_M_create
                                              ((ulong *)&local_1f0,(ulong)&local_190);
                    local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_190._M_dataplus._M_p;
                    *local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)0x642067616c66203b;
                    local_1f0[1] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)0x6974706972637365;
                    *(undefined4 *)(local_1f0 + 2) = 0x203a6e6f;
                    local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_190._M_dataplus._M_p;
                    *(char *)((long)local_1f0 + (long)local_190._M_dataplus._M_p) = '\0';
                    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
                    local_210 = &local_200;
                    plVar17 = puVar16 + 2;
                    if ((long *)*puVar16 == plVar17) {
                      local_200 = *plVar17;
                      lStack_1f8 = puVar16[3];
                    }
                    else {
                      local_200 = *plVar17;
                      local_210 = (long *)*puVar16;
                    }
                    local_208 = puVar16[1];
                    *puVar16 = plVar17;
                    puVar16[1] = 0;
                    *(undefined1 *)(puVar16 + 2) = 0;
                    pmVar15 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[](&local_118.error_flags_,&local_1d0);
                    std::__cxx11::string::_M_append((char *)pmVar15,(ulong)local_210);
                    if (local_210 != &local_200) {
                      operator_delete(local_210);
                    }
                    if (local_1f0 != &local_1e0) {
                      operator_delete(local_1f0);
                    }
                  }
                  pmVar15 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&local_118.error_flags_,&local_1d0);
                  bVar7 = true;
                  std::__cxx11::string::append((char *)pmVar15);
                  goto LAB_00192099;
                }
                pcVar4 = (*argv)[(int)uVar1];
                uVar23 = uVar1;
                local_168 = pcVar4;
                if ((*pcVar4 == '-') &&
                   (iVar8 = strcmp(&(anonymous_namespace)::FlagValue::TypeName()::types + lVar11 * 7
                                   ,"string"), iVar8 == 0)) {
                  pcVar13 = flag->help_;
                  pcVar12 = strstr(pcVar13,"true");
                  if ((pcVar12 != (char *)0x0) ||
                     (pcVar13 = strstr(pcVar13,"false"), pcVar13 != (char *)0x0)) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Did you really mean to set flag \'",0x21);
                    pcVar13 = flag->name_;
                    if (pcVar13 == (char *)0x0) {
                      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1d35f8);
                    }
                    else {
                      sVar14 = strlen(pcVar13);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,pcVar13,sVar14);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"\' to the value \'",0x10);
                    sVar14 = strlen(pcVar4);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,pcVar4,sVar14);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"\'?",2);
                  }
                }
              }
              (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                        (&local_b0,&local_118,flag,local_168,SET_FLAGS_VALUE);
              bVar7 = false;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
            }
LAB_00192099:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p);
            }
          }
        }
        else {
          __dest = *argv + (int)uVar23;
          memmove(__dest,__dest + 1,(long)(int)(~uVar23 + *local_170) << 3);
          (*argv)[(long)(int)*puVar6 + -1] = pcVar4;
          uVar9 = uVar9 - 1;
          uVar23 = uVar23 - 1;
          bVar7 = false;
        }
      } while ((!bVar7) && (uVar23 = uVar23 + 1, (int)uVar23 < (int)uVar9));
    }
    pMVar2 = &(local_118.registry_)->lock_;
    pMVar2->mutex_ = pMVar2->mutex_ + 1;
    if (pMVar2->mutex_ == 0) {
      if ((char)local_160 != '\0') {
        (*argv)[(long)(int)uVar9 + -1] = **argv;
        *argv = *argv + (long)(int)uVar9 + -1;
        *local_170 = (*local_170 - uVar9) + 1;
        uVar9 = 1;
      }
      if ((char)local_15c != '\0') {
        HandleCommandLineHelpFlags();
      }
      pFVar10 = local_118.registry_;
      pMVar2 = &(local_118.registry_)->lock_;
      iVar8 = pMVar2->mutex_;
      pMVar2->mutex_ = pMVar2->mutex_ + -1;
      if (iVar8 != 0) goto LAB_0019286c;
      p_Var18 = ((local_118.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      if ((_Rb_tree_header *)p_Var18 !=
          &((local_118.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header) {
        do {
          bVar7 = anon_unknown_1::CommandLineFlag::Validate
                            ((CommandLineFlag *)p_Var18[1]._M_parent,
                             ((CommandLineFlag *)p_Var18[1]._M_parent)->current_);
          if (!bVar7) {
            std::__cxx11::string::string
                      ((string *)&local_1d0,*(char **)p_Var18[1]._M_parent,(allocator *)&local_1b0);
            pmVar15 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&local_118.error_flags_,&local_1d0);
            sVar5 = pmVar15->_M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p);
            }
            if (sVar5 == 0) {
              local_1f0 = &local_1e0;
              local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x203a524f525245;
              local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x7;
              puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
              local_210 = &local_200;
              plVar17 = puVar16 + 2;
              if ((long *)*puVar16 == plVar17) {
                local_200 = *plVar17;
                lStack_1f8 = puVar16[3];
              }
              else {
                local_200 = *plVar17;
                local_210 = (long *)*puVar16;
              }
              local_208 = puVar16[1];
              *puVar16 = plVar17;
              puVar16[1] = 0;
              *(undefined1 *)(puVar16 + 2) = 0;
              plVar17 = (long *)std::__cxx11::string::append((char *)&local_210);
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
              puVar22 = (ulong *)(plVar17 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar17 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar22) {
                local_1b0.field_2._M_allocated_capacity = *puVar22;
                local_1b0.field_2._8_8_ = plVar17[3];
              }
              else {
                local_1b0.field_2._M_allocated_capacity = *puVar22;
                local_1b0._M_dataplus._M_p = (pointer)*plVar17;
              }
              local_1b0._M_string_length = plVar17[1];
              *plVar17 = (long)puVar22;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              plVar17 = (long *)std::__cxx11::string::append((char *)&local_1b0);
              puVar22 = (ulong *)(plVar17 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar17 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar22) {
                local_1d0.field_2._M_allocated_capacity = *puVar22;
                local_1d0.field_2._8_8_ = plVar17[3];
                local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
              }
              else {
                local_1d0.field_2._M_allocated_capacity = *puVar22;
                local_1d0._M_dataplus._M_p = (pointer)*plVar17;
              }
              local_1d0._M_string_length = plVar17[1];
              *plVar17 = (long)puVar22;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              std::__cxx11::string::string
                        ((string *)&local_190,*(char **)p_Var18[1]._M_parent,(allocator *)&local_158
                        );
              pmVar15 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&local_118.error_flags_,&local_190);
              std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                operator_delete(local_1b0._M_dataplus._M_p);
              }
              if (local_210 != &local_200) {
                operator_delete(local_210);
              }
              if (local_1f0 != &local_1e0) {
                operator_delete(local_1f0);
              }
            }
          }
          p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
        } while ((_Rb_tree_header *)p_Var18 !=
                 &((local_118.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header);
      }
      pMVar2 = &pFVar10->lock_;
      pMVar2->mutex_ = pMVar2->mutex_ + 1;
      if (pMVar2->mutex_ == 0) {
        bVar7 = anon_unknown_1::CommandLineFlagParser::ReportErrors(&local_118);
        if (!bVar7) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_118.undefined_names_._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_118.error_flags_._M_t);
          return uVar9;
        }
        uVar9 = (*(code *)gflags_exitfunc)(1);
        return uVar9;
      }
    }
  }
  __assert_fail("mutex_++ == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
}

Assistant:

static uint32 ParseCommandLineFlagsInternal(int* argc, char*** argv,
                                            bool remove_flags, bool do_report) {
  SetArgv(*argc, const_cast<const char**>(*argv));    // save it for later

  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  CommandLineFlagParser parser(registry);

  // When we parse the commandline flags, we'll handle --flagfile,
  // --tryfromenv, etc. as we see them (since flag-evaluation order
  // may be important).  But sometimes apps set FLAGS_tryfromenv/etc.
  // manually before calling ParseCommandLineFlags.  We want to evaluate
  // those too, as if they were the first flags on the commandline.
  registry->Lock();
  parser.ProcessFlagfileLocked(FLAGS_flagfile, SET_FLAGS_VALUE);
  // Last arg here indicates whether flag-not-found is a fatal error or not
  parser.ProcessFromenvLocked(FLAGS_fromenv, SET_FLAGS_VALUE, true);
  parser.ProcessFromenvLocked(FLAGS_tryfromenv, SET_FLAGS_VALUE, false);
  registry->Unlock();

  // Now get the flags specified on the commandline
  const int r = parser.ParseNewCommandLineFlags(argc, argv, remove_flags);

  if (do_report)
    HandleCommandLineHelpFlags();   // may cause us to exit on --help, etc.

  // See if any of the unset flags fail their validation checks
  parser.ValidateAllFlags();

  if (parser.ReportErrors())        // may cause us to exit on illegal flags
    gflags_exitfunc(1);
  return r;
}